

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  curl_trc_feat *pcVar1;
  undefined8 __n;
  int iVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  FILE *__stream;
  uchar *inputbuff;
  char *__haystack;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  size_t sVar13;
  uchar *pem_ptr;
  dynbuf buf;
  size_t pem_len;
  char buffer [1024];
  
  if (pinnedpubkey == (char *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    if (pubkeylen != 0 && pubkey != (uchar *)0x0) {
      iVar2 = strncmp(pinnedpubkey,"sha256//",8);
      if (iVar2 == 0) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buf.bufr = (char *)0x0;
        if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
          CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          inputbuff = (uchar *)(*Curl_cmalloc)(0x20);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (inputbuff != (uchar *)0x0) {
            CVar3 = (*Curl_ssl->sha256sum)(pubkey,pubkeylen,inputbuff,0x20);
            if (CVar3 == CURLE_OK) {
              CVar3 = Curl_base64_encode((char *)inputbuff,0x20,&buf.bufr,(size_t *)buffer);
            }
            (*Curl_cfree)(inputbuff);
            if (CVar3 == CURLE_OK) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar1->log_level)))) {
                Curl_infof(data," public key hash: sha256//%s",buf.bufr);
              }
              pcVar10 = (*Curl_cstrdup)(pinnedpubkey);
              pcVar9 = pcVar10;
              if (pcVar10 == (char *)0x0) {
                (*Curl_cfree)(buf.bufr);
                CVar3 = CURLE_OUT_OF_MEMORY;
              }
              else {
                do {
                  __haystack = strstr(pcVar9,";sha256//");
                  __n = buffer._0_8_;
                  if (__haystack != (char *)0x0) {
                    *__haystack = '\0';
                  }
                  sVar5 = strlen(pcVar9 + 8);
                  pcVar11 = buf.bufr;
                  if (__n == sVar5) {
                    iVar2 = bcmp(buf.bufr,pcVar9 + 8,__n);
                    if ((__haystack == (char *)0x0) || (iVar2 == 0)) {
                      CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                      if (iVar2 == 0) {
                        CVar3 = CURLE_OK;
                      }
                      goto LAB_0016dc38;
                    }
                  }
                  else if (__haystack == (char *)0x0) break;
                  *__haystack = ';';
                  pcVar9 = strstr(__haystack,"sha256//");
                } while (pcVar9 != (char *)0x0);
                CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                pcVar11 = buf.bufr;
LAB_0016dc38:
                (*Curl_cfree)(pcVar11);
                buf.bufr = (char *)0x0;
                (*Curl_cfree)(pcVar10);
              }
            }
          }
        }
      }
      else {
        pem_ptr = (uchar *)0x0;
        __stream = fopen64(pinnedpubkey,"rb");
        if (__stream != (FILE *)0x0) {
          Curl_dyn_init(&buf,0x100000);
          iVar2 = fseek(__stream,0,2);
          CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (iVar2 == 0) {
            uVar6 = ftell(__stream);
            iVar2 = fseek(__stream,0,0);
            if (((uVar6 < 0x100001) && (iVar2 == 0)) &&
               (sVar7 = curlx_sotouz(uVar6), pubkeylen <= sVar7)) {
              sVar13 = sVar7;
              do {
                sVar5 = 0x400;
                if (sVar13 < 0x400) {
                  sVar5 = sVar13;
                }
                sVar8 = fread(buffer,1,sVar5,__stream);
                if ((sVar5 != sVar8) ||
                   (CVar4 = Curl_dyn_addn(&buf,buffer,sVar5), CVar4 != CURLE_OK)) goto LAB_0016d9b6;
                sVar13 = sVar13 - sVar5;
              } while (sVar13 != 0);
              pcVar9 = Curl_dyn_ptr(&buf);
              if (sVar7 == pubkeylen) {
                iVar2 = bcmp(pubkey,pcVar9,pubkeylen);
                CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                if (iVar2 == 0) {
                  CVar3 = CURLE_OK;
                }
              }
              else if (pcVar9 != (char *)0x0) {
                Curl_dyn_init((dynbuf *)buffer,0x100000);
                pcVar10 = strstr(pcVar9,"-----BEGIN PUBLIC KEY-----");
                if (((pcVar10 != (char *)0x0) &&
                    ((lVar12 = (long)pcVar10 - (long)pcVar9, lVar12 == 0 ||
                     (pcVar9[lVar12 + -1] == '\n')))) &&
                   (pcVar10 = strstr(pcVar9 + lVar12 + 0x1a,"\n-----END PUBLIC KEY-----"),
                   pcVar10 != (char *)0x0)) {
                  for (uVar6 = lVar12 + 0x1a; uVar6 < (ulong)((long)pcVar10 - (long)pcVar9);
                      uVar6 = uVar6 + 1) {
                    if (((pcVar9[uVar6] != '\n') && (pcVar9[uVar6] != '\r')) &&
                       (CVar4 = Curl_dyn_addn((dynbuf *)buffer,pcVar9 + uVar6,1), CVar4 != CURLE_OK)
                       ) goto LAB_0016d9b6;
                  }
                  pcVar9 = Curl_dyn_ptr((dynbuf *)buffer);
                  CVar4 = Curl_base64_decode(pcVar9,&pem_ptr,&pem_len);
                  Curl_dyn_free((dynbuf *)buffer);
                  if ((CVar4 == CURLE_OK) && (pem_len == pubkeylen)) {
                    iVar2 = bcmp(pubkey,pem_ptr,pubkeylen);
                    CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                    if (iVar2 == 0) {
                      CVar3 = CURLE_OK;
                    }
                  }
                }
              }
            }
          }
LAB_0016d9b6:
          Curl_dyn_free(&buf);
          (*Curl_cfree)(pem_ptr);
          pem_ptr = (uchar *)0x0;
          fclose(__stream);
        }
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* if a path was not specified, do not pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(!strncmp(pinnedpubkey, "sha256//", 8)) {
    CURLcode encode;
    size_t encodedlen = 0;
    char *encoded = NULL, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                                 sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(!encode)
      encode = Curl_base64_encode((char *)sha256sumdigest,
                                  CURL_SHA256_DIGEST_LENGTH, &encoded,
                                  &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, " public key hash: sha256//%s", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeycopy = strdup(pinnedpubkey);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it will go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
  }
  else {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;
    struct dynbuf buf;
    char unsigned *pem_ptr = NULL;
    size_t left;
    FILE *fp = fopen(pinnedpubkey, "rb");
    if(!fp)
      return result;

    Curl_dyn_init(&buf, MAX_PINNED_PUBKEY_SIZE);

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      goto end;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      goto end;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      goto end;

    /*
     * if the size of our certificate is bigger than the file
     * size then it cannot match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      goto end;

    /*
     * Read the file into the dynbuf
     */
    left = size;
    do {
      char buffer[1024];
      size_t want = left > sizeof(buffer) ? sizeof(buffer) : left;
      if(want != fread(buffer, 1, want, fp))
        goto end;
      if(Curl_dyn_addn(&buf, buffer, want))
        goto end;
      left -= want;
    } while(left);

    /* If the sizes are the same, it cannot be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, Curl_dyn_ptr(&buf), pubkeylen))
        result = CURLE_OK;
      goto end;
    }

    /*
     * Otherwise we will assume it is PEM and try to decode it
     * after placing null terminator
     */
    pem_read = pubkey_pem_to_der(Curl_dyn_ptr(&buf), &pem_ptr, &pem_len);
    /* if it was not read successfully, exit */
    if(pem_read)
      goto end;

    /*
     * if the size of our certificate does not match the size of
     * the decoded file, they cannot be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
end:
    Curl_dyn_free(&buf);
    Curl_safefree(pem_ptr);
    fclose(fp);
  }

  return result;
}